

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertInt::test
          (ShaderBitfieldOperationCaseBitfieldInsertInt *this,Data *data)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = (ulong)this->m_components;
  if ((long)uVar4 < 1) {
    return true;
  }
  uVar5 = ~(-1 << ((byte)data->bits & 0x1f));
  if (data->bits == 0x20) {
    uVar5 = 0xffffffff;
  }
  bVar2 = (byte)data->offset;
  uVar6 = ~(uVar5 << (bVar2 & 0x1f));
  if (data->outIvec4[0] !=
      ((data->in2Ivec4[0] & uVar5) << (bVar2 & 0x1f) | data->inIvec4[0] & uVar6)) {
    return false;
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (uVar4 - 1 == lVar3) break;
    lVar1 = lVar3 + 1;
  } while (data->outIvec4[lVar3 + 1] ==
           ((data->in2Ivec4[lVar3 + 1] & uVar5) << (bVar2 & 0x1f) | data->inIvec4[lVar3 + 1] & uVar6
           ));
  return uVar4 <= lVar3 + 1U;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint mask = (data->bits == 32) ? ~0u : (1 << data->bits) - 1;
			GLint  expected =
				(data->inIvec4[i] & ~(mask << data->offset)) | ((data->in2Ivec4[i] & mask) << data->offset);
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}